

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_load.cpp
# Opt level: O1

void MapOptHandler_fs_nocheckposition(FMapInfoParser *parse,level_info_t *info)

{
  bool bVar1;
  FFsOptions *pFVar2;
  FName local_14;
  
  FName::NameManager::FindName(&FName::NameData,"fragglescript",false);
  pFVar2 = level_info_t::GetOptData<FFsOptions>(info,&local_14,true);
  bVar1 = FMapInfoParser::CheckAssign(parse);
  if (bVar1) {
    FScanner::MustGetNumber(&parse->sc);
    (pFVar2->super_FOptionalMapinfoData).field_0x14 = (parse->sc).Number != 0;
  }
  else {
    (pFVar2->super_FOptionalMapinfoData).field_0x14 = 1;
  }
  return;
}

Assistant:

DEFINE_MAP_OPTION(fs_nocheckposition, false)
{
	FFsOptions *opt = info->GetOptData<FFsOptions>("fragglescript");

	if (parse.CheckAssign())
	{
		parse.sc.MustGetNumber();
		opt->nocheckposition = !!parse.sc.Number;
	}
	else
	{
		opt->nocheckposition = true;
	}
}